

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  string module_name;
  string local_50;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x18)) {
    lVar2 = 0;
    do {
      anon_unknown_0::ModuleName
                (&local_50,(string *)**(undefined8 **)(*(long *)(pFVar1 + 0x20) + lVar2 * 8));
      io::Printer::Print(this->printer_,"import $module$\n","module",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
      pFVar1 = this->file_;
    } while (lVar2 < *(int *)(pFVar1 + 0x18));
  }
  io::Printer::Print(this->printer_,"\n");
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x28)) {
    lVar2 = 0;
    do {
      anon_unknown_0::ModuleName
                (&local_50,
                 (string *)
                 **(undefined8 **)
                   (*(long *)(pFVar1 + 0x20) +
                   (long)*(int *)(*(long *)(pFVar1 + 0x30) + lVar2 * 4) * 8));
      io::Printer::Print(this->printer_,"from $module$ import *\n","module",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
      pFVar1 = this->file_;
    } while (lVar2 < *(int *)(pFVar1 + 0x28));
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    string module_name = ModuleName(file_->dependency(i)->name());
    printer_->Print("import $module$\n", "module",
                    module_name);
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}